

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_model(lylyb_ctx *lybctx,uint32_t parse_options,ly_bool with_features,
                      lys_module **mod)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *local_c8;
  char *local_a8;
  ly_set *local_88;
  uint32_t local_68;
  uint uStack_64;
  ly_bool enabled;
  uint32_t idx;
  uint32_t i;
  lysp_feature *f;
  ly_set feat_set;
  char mod_rev [11];
  char *mod_name;
  lys_module *m;
  LY_ERR ret;
  lys_module **mod_local;
  ly_bool with_features_local;
  uint32_t parse_options_local;
  lylyb_ctx *lybctx_local;
  
  mod_name = (char *)0x0;
  mod_rev[3] = '\0';
  mod_rev[4] = '\0';
  mod_rev[5] = '\0';
  mod_rev[6] = '\0';
  mod_rev[7] = '\0';
  mod_rev[8] = '\0';
  mod_rev[9] = '\0';
  mod_rev[10] = '\0';
  memset(&f,0,0x10);
  _idx = (lysp_feature *)0x0;
  local_68 = 0;
  if (with_features == '\0') {
    local_88 = (ly_set *)0x0;
  }
  else {
    local_88 = (ly_set *)&f;
  }
  m._4_4_ = lyb_read_model(lybctx,(char **)(mod_rev + 3),(char *)((long)&feat_set.field_2 + 5),
                           local_88);
  if (m._4_4_ == LY_SUCCESS) {
    if (feat_set.field_2._5_1_ == '\0') {
      mod_name = (char *)ly_ctx_get_module_latest(lybctx->ctx,(char *)mod_rev._3_8_);
    }
    else {
      mod_name = (char *)ly_ctx_get_module(lybctx->ctx,(char *)mod_rev._3_8_,
                                           (char *)((long)&feat_set.field_2 + 5));
      if (((((parse_options & 0x100000) != 0) && ((lys_module *)mod_name == (lys_module *)0x0)) &&
          (mod_name = (char *)ly_ctx_get_module_implemented(lybctx->ctx,(char *)mod_rev._3_8_),
          (lys_module *)mod_name != (lys_module *)0x0)) &&
         ((((lys_module *)mod_name)->revision == (char *)0x0 ||
          (iVar2 = strcmp(((lys_module *)mod_name)->revision,(char *)((long)&feat_set.field_2 + 5)),
          iVar2 < 0)))) {
        mod_name = (char *)0x0;
      }
    }
    if ((mod_name == (char *)0x0) || (mod_name[0x78] == '\0')) {
      if ((parse_options & 0x20000) != 0) {
        if (mod_name == (char *)0x0) {
          pcVar3 = "";
          if (feat_set.field_2._5_1_ == '\0') {
            local_a8 = "";
          }
          else {
            pcVar3 = "@";
            local_a8 = (char *)((long)&feat_set.field_2 + 5);
          }
          ly_log(lybctx->ctx,LY_LLERR,LY_EINVAL,
                 "Invalid context for LYB data parsing, missing module \"%s%s%s\".",mod_rev._3_8_,
                 pcVar3,local_a8);
        }
        else if (mod_name[0x78] == '\0') {
          pcVar3 = "";
          if (feat_set.field_2._5_1_ == '\0') {
            local_c8 = "";
          }
          else {
            pcVar3 = "@";
            local_c8 = (char *)((long)&feat_set.field_2 + 5);
          }
          ly_log(lybctx->ctx,LY_LLERR,LY_EINVAL,
                 "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
                 mod_rev._3_8_,pcVar3,local_c8);
        }
        m._4_4_ = LY_EINVAL;
      }
    }
    else if (with_features == '\0') {
LAB_00153bd4:
      lyb_cache_module_hash((lys_module *)mod_name);
    }
    else {
      do {
        _idx = lysp_feature_next(_idx,*(lysp_module **)(mod_name + 0x50),&local_68);
        if (_idx == (lysp_feature *)0x0) goto LAB_00153bd4;
        bVar1 = false;
        for (uStack_64 = 0; uStack_64 < f._4_4_; uStack_64 = uStack_64 + 1) {
          iVar2 = strcmp(*(char **)(feat_set._0_8_ + (ulong)uStack_64 * 8),_idx->name);
          if (iVar2 == 0) {
            bVar1 = true;
            break;
          }
        }
        if ((bVar1) && ((_idx->flags & 0x20) == 0)) {
          ly_log(lybctx->ctx,LY_LLERR,LY_EINVAL,
                 "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.",
                 mod_rev._3_8_,_idx->name);
          m._4_4_ = LY_EINVAL;
          goto LAB_00153bdd;
        }
      } while ((bVar1) || ((_idx->flags & 0x20) == 0));
      ly_log(lybctx->ctx,LY_LLERR,LY_EINVAL,
             "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.",
             mod_rev._3_8_,_idx->name);
      m._4_4_ = LY_EINVAL;
    }
  }
LAB_00153bdd:
  *mod = (lys_module *)mod_name;
  free((void *)mod_rev._3_8_);
  ly_set_erase((ly_set *)&f,free);
  return m._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_model(struct lylyb_ctx *lybctx, uint32_t parse_options, ly_bool with_features, const struct lys_module **mod)
{
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *m = NULL;
    char *mod_name = NULL, mod_rev[LY_REV_SIZE];
    struct ly_set feat_set = {0};
    struct lysp_feature *f = NULL;
    uint32_t i, idx = 0;
    ly_bool enabled;

    /* read module info */
    if ((ret = lyb_read_model(lybctx, &mod_name, mod_rev, with_features ? &feat_set : NULL))) {
        goto cleanup;
    }

    /* get the module */
    if (mod_rev[0]) {
        m = ly_ctx_get_module(lybctx->ctx, mod_name, mod_rev);
        if ((parse_options & LYD_PARSE_LYB_MOD_UPDATE) && !m) {
            /* try to use an updated module */
            m = ly_ctx_get_module_implemented(lybctx->ctx, mod_name);
            if (m && (!m->revision || (strcmp(m->revision, mod_rev) < 0))) {
                /* not an implemented module in a newer revision */
                m = NULL;
            }
        }
    } else {
        m = ly_ctx_get_module_latest(lybctx->ctx, mod_name);
    }

    if (!m || !m->implemented) {
        if (parse_options & LYD_PARSE_STRICT) {
            if (!m) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            } else if (!m->implemented) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            }
            ret = LY_EINVAL;
            goto cleanup;
        }

        goto cleanup;
    }

    if (with_features) {
        /* check features */
        while ((f = lysp_feature_next(f, m->parsed, &idx))) {
            enabled = 0;
            for (i = 0; i < feat_set.count; ++i) {
                if (!strcmp(feat_set.objs[i], f->name)) {
                    enabled = 1;
                    break;
                }
            }

            if (enabled && !(f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            } else if (!enabled && (f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* fill cached hashes, if not already */
    lyb_cache_module_hash(m);

cleanup:
    *mod = m;
    free(mod_name);
    ly_set_erase(&feat_set, free);
    return ret;
}